

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  size_type *psVar1;
  tm *ptVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  time_t seconds;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  long *local_200;
  undefined8 local_1f8;
  long local_1f0;
  undefined8 uStack_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  long local_1d0;
  undefined8 uStack_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 uStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  int local_5c;
  string local_58;
  long local_38;
  
  local_38 = (long)this / 1000;
  ptVar2 = localtime(&local_38);
  if (ptVar2 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_5c = ptVar2->tm_year + 0x76c;
  StreamableToString<int>(&local_58,&local_5c);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_170 = *puVar5;
    lStack_168 = plVar3[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *puVar5;
    local_180 = (ulong *)*plVar3;
  }
  local_178 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_(&local_80,(String *)(ulong)(ptVar2->tm_mon + 1),(int)local_178)
  ;
  uVar6 = 0xf;
  if (local_180 != &local_170) {
    uVar6 = local_170;
  }
  if (uVar6 < local_80._M_string_length + local_178) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar7 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_80._M_string_length + local_178) goto LAB_0015126a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_0015126a:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_80._M_dataplus._M_p);
  }
  local_200 = &local_1f0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_1f0 = *plVar3;
    uStack_1e8 = puVar4[3];
  }
  else {
    local_1f0 = *plVar3;
    local_200 = (long *)*puVar4;
  }
  local_1f8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_200);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_210 = *puVar5;
    lStack_208 = plVar3[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *puVar5;
    local_220 = (ulong *)*plVar3;
  }
  local_218 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_a0,(String *)(ulong)(uint)ptVar2->tm_mday,(int)local_218);
  uVar6 = 0xf;
  if (local_220 != &local_210) {
    uVar6 = local_210;
  }
  if (uVar6 < local_a0._M_string_length + local_218) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar7 = local_a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_a0._M_string_length + local_218) goto LAB_0015138c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_220);
  }
  else {
LAB_0015138c:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_a0._M_dataplus._M_p);
  }
  local_1e0 = &local_1d0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_1d0 = *plVar3;
    uStack_1c8 = puVar4[3];
  }
  else {
    local_1d0 = *plVar3;
    local_1e0 = (long *)*puVar4;
  }
  local_1d8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_150 = *puVar5;
    lStack_148 = plVar3[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar5;
    local_160 = (ulong *)*plVar3;
  }
  local_158 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_c0,(String *)(ulong)(uint)ptVar2->tm_hour,(int)local_158);
  uVar6 = 0xf;
  if (local_160 != &local_150) {
    uVar6 = local_150;
  }
  if (uVar6 < local_c0._M_string_length + local_158) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      uVar7 = local_c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_c0._M_string_length + local_158) goto LAB_001514bf;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_160);
  }
  else {
LAB_001514bf:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_c0._M_dataplus._M_p);
  }
  local_1c0 = &local_1b0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_1b0 = *plVar3;
    uStack_1a8 = puVar4[3];
  }
  else {
    local_1b0 = *plVar3;
    local_1c0 = (long *)*puVar4;
  }
  local_1b8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_130 = *puVar5;
    lStack_128 = plVar3[3];
    local_140 = &local_130;
  }
  else {
    local_130 = *puVar5;
    local_140 = (ulong *)*plVar3;
  }
  local_138 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_(&local_e0,(String *)(ulong)(uint)ptVar2->tm_min,(int)local_138)
  ;
  uVar6 = 0xf;
  if (local_140 != &local_130) {
    uVar6 = local_130;
  }
  if (uVar6 < local_e0._M_string_length + local_138) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar7 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_e0._M_string_length + local_138) goto LAB_001515f4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_140);
  }
  else {
LAB_001515f4:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_e0._M_dataplus._M_p);
  }
  local_1a0 = &local_190;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_190 = *plVar3;
    uStack_188 = puVar4[3];
  }
  else {
    local_190 = *plVar3;
    local_1a0 = (long *)*puVar4;
  }
  local_198 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_110 = *puVar5;
    lStack_108 = plVar3[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar5;
    local_120 = (ulong *)*plVar3;
  }
  local_118 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_100,(String *)(ulong)(uint)ptVar2->tm_sec,(int)local_118);
  uVar6 = 0xf;
  if (local_120 != &local_110) {
    uVar6 = local_110;
  }
  if (uVar6 < local_100._M_string_length + local_118) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar7 = local_100.field_2._M_allocated_capacity;
    }
    if (local_100._M_string_length + local_118 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_120);
      goto LAB_0015175a;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100._M_dataplus._M_p);
LAB_0015175a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  // Using non-reentrant version as localtime_r is not portable.
  time_t seconds = static_cast<time_t>(ms / 1000);
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4996)  // Temporarily disables warning 4996
                                // (function or variable may be unsafe).
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
# pragma warning(pop)           // Restores the warning state again.
#else
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
#endif
  if (time_struct == NULL)
    return "";  // Invalid ms value

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct->tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct->tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct->tm_mday) + "T" +
      String::FormatIntWidth2(time_struct->tm_hour) + ":" +
      String::FormatIntWidth2(time_struct->tm_min) + ":" +
      String::FormatIntWidth2(time_struct->tm_sec);
}